

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::StorageCompatibilityVersionSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  string version_string;
  SerializationCompatibility serialization_compatibility;
  string local_60;
  SerializationCompatibility local_40;
  
  Value::GetValue<std::__cxx11::string>(&local_60,input);
  SerializationCompatibility::FromString(&local_40,&local_60);
  SerializationCompatibility::operator=(&(config->options).serialization_compatibility,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void StorageCompatibilityVersionSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto version_string = input.GetValue<string>();
	auto serialization_compatibility = SerializationCompatibility::FromString(version_string);
	config.options.serialization_compatibility = serialization_compatibility;
}